

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

void __thiscall
BayesianGameForDecPOMDPStage::Fill_joI_Array
          (BayesianGameForDecPOMDPStage *this,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI,Index *joI_arr)

{
  Index ohI;
  PlanningUnitMADPDiscrete *this_00;
  Index t;
  int iVar1;
  Index IVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer *ppuVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint agentI;
  ulong uVar8;
  ulong __n;
  long lVar9;
  undefined8 uStack_b0;
  Index aIStack_a8 [2];
  undefined1 local_a0 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivObservations;
  long local_78;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indOHI;
  allocator_type local_36;
  allocator_type local_35;
  Index local_34;
  
  uStack_b0 = 0x37a69a;
  local_34 = ts;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,indTypes);
  uStack_b0 = 0x37a6ad;
  indOHI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  iVar1 = (*(this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
            super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
            super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
  uStack_b0 = 0x37a6bd;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &indivObservations.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,CONCAT44(extraout_var,iVar1),
             &local_36);
  IVar2 = local_34;
  __n = (ulong)local_34;
  uStack_b0 = 0x37a6d8;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_a0,__n,
           (value_type *)
           &indivObservations.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_35);
  if (indivObservations.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    uStack_b0 = 0x37a6ed;
    operator_delete(indivObservations.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    local_78 -
                    (long)indivObservations.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  agentI = 0;
  do {
    uStack_b0 = 0x37a70a;
    iVar1 = (*(this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
              super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
    t = local_34;
    uVar8 = (ulong)agentI;
    if (CONCAT44(extraout_var_00,iVar1) <= uVar8) {
      if (local_34 != 0) {
        lVar9 = 0;
        do {
          uStack_b0 = 0x37a7f8;
          IVar2 = (**(code **)(**(long **)(*(long *)(indOHI.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 0x42) + 0x30) + 0xe0))
                            (*(long **)(*(long *)(indOHI.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 + 0x42) + 0x30),
                             (long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     local_a0)->_M_impl).super__Vector_impl_data._M_start + lVar9);
          *joI_arr = IVar2;
          joI_arr = joI_arr + 1;
          lVar9 = lVar9 + 0x18;
        } while (__n * 0x18 != lVar9);
      }
      uStack_b0 = 0x37a813;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_a0);
      if (local_58 != (undefined1  [8])0x0) {
        uStack_b0 = 0x37a828;
        operator_delete((void *)local_58,
                        (long)indOHI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_58);
      }
      return;
    }
    *(pointer)((long)local_58 + uVar8 * 4) =
         *(pointer)((long)local_58 + uVar8 * 4) +
         (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar8];
    lVar9 = -(__n * 4 + 0xf & 0xfffffffffffffff0);
    this_00 = *(PlanningUnitMADPDiscrete **)
               (indOHI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 0x42);
    ohI = *(Index *)((long)local_58 + uVar8 * 4);
    *(undefined8 *)((long)aIStack_a8 + lVar9 + -8) = 0x37a757;
    PlanningUnitMADPDiscrete::GetObservationHistoryArrays
              (this_00,agentI,ohI,t,(Index *)((long)aIStack_a8 + lVar9));
    if (local_34 != 0) {
      uVar4 = ((long)indivObservations.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)local_a0 >> 3) *
              -0x5555555555555555;
      ppuVar3 = &(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0)->_M_impl).
                 super__Vector_impl_data._M_finish;
      uVar5 = 0;
      do {
        uVar7 = uVar4;
        uVar6 = uVar5;
        if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
LAB_0037a83d:
          *(undefined1 **)((long)aIStack_a8 + lVar9 + -8) = &LAB_0037a84b;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6,uVar7);
        }
        uVar7 = (long)*ppuVar3 - (long)((_Vector_impl_data *)(ppuVar3 + -1))->_M_start >> 2;
        uVar6 = uVar8;
        if (uVar7 <= uVar8) goto LAB_0037a83d;
        ((_Vector_impl_data *)(ppuVar3 + -1))->_M_start[uVar8] =
             ((Index *)((long)aIStack_a8 + lVar9))[uVar5];
        uVar5 = uVar5 + 1;
        ppuVar3 = ppuVar3 + 3;
      } while (IVar2 != (uint)uVar5);
    }
    agentI = agentI + 1;
  } while( true );
}

Assistant:

void BayesianGameForDecPOMDPStage::Fill_joI_Array(const Index ts, 
        const vector<Index>& indTypes, 
        const vector<Index>& firstOHtsI, 
        Index* joI_arr)
{           
    //convert indiv type indices to ind. observation history indices:
    vector<Index> indOHI = vector<Index>(indTypes);
    // indivObservations[ti][agI]  will contain the observation agI received at tI+1
    vector< vector<Index> > indivObservations(ts,vector<Index>(GetNrAgents()) );
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        indOHI[agentI] += firstOHtsI[agentI];
        Index obsArr[ts];
        _m_pu->GetObservationHistoryArrays(agentI, indOHI[agentI], ts, obsArr);
        //now obsArr is filled and can be copied into indivObservations
        for(Index tI=0; tI < ts; tI++)
            indivObservations.at(tI).at(agentI) = obsArr[tI];
    }

    for(Index tI=0; tI < ts; tI++)
        joI_arr[tI] = _m_pu->IndividualToJointObservationIndices(
                indivObservations[tI] );
}